

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

Color * __thiscall svg::Color::toString_abi_cxx11_(Color *this,Layout *param_1)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [384];
  Layout *param_1_local;
  Color *this_local;
  
  param_1_local = param_1;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (((ulong)(param_1->dimensions).height & 1) == 0) {
    poVar1 = std::operator<<(local_198,"rgb(");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)((long)&(param_1->dimensions).height + 4));
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&param_1->scale);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&param_1->scale + 4));
    std::operator<<(poVar1,")");
  }
  else {
    std::operator<<(local_198,"transparent");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string toString(Layout const &) const
        {
            std::stringstream ss;
            if (transparent)
                ss << "transparent";
            else
                ss << "rgb(" << red << "," << green << "," << blue << ")";
            return ss.str();
        }